

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3f3ba::dot_grad_test_calculation_Test::TestBody
          (dot_grad_test_calculation_Test *this)

{
  axes_type *__return_storage_ptr__;
  bool bVar1;
  double *pdVar2;
  char *pcVar3;
  AssertHelper local_230;
  Message local_228;
  int local_21c;
  array<unsigned_int,_2UL> local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_6;
  Message local_1f8;
  int local_1ec;
  array<unsigned_int,_2UL> local_1e8;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_5;
  Message local_1c8;
  int local_1bc;
  array<unsigned_int,_2UL> local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_4;
  Message local_198;
  int local_18c;
  array<unsigned_int,_2UL> local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_3;
  Message local_168;
  int local_15c;
  array<unsigned_int,_2UL> local_158;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_2;
  Message local_138;
  int local_12c;
  array<unsigned_int,_2UL> local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_1;
  Message local_108;
  int local_fc;
  array<unsigned_int,_2UL> local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar;
  matrix grad_x;
  undefined1 local_a0 [8];
  matrix grad_W;
  dotgrad_ret_type res;
  dot_grad_test_calculation_Test *this_local;
  
  __return_storage_ptr__ = &grad_W.super_tensor<double,_2U>._shape;
  res.grad_x.super_tensor<double,_2U>._shape._M_elems = (_Type)this;
  dnet::nn::cal_dot_grad
            ((dotgrad_ret_type *)__return_storage_ptr__,(this->super_dot_grad_test)._W,
             (this->super_dot_grad_test)._x,(this->super_dot_grad_test)._grad_y);
  dnet::data_types::matrix::matrix((matrix *)local_a0,(matrix *)__return_storage_ptr__);
  dnet::data_types::matrix::matrix
            ((matrix *)&gtest_ar.message_,(matrix *)&res.grad_w.super_tensor<double,_2U>._shape);
  local_f8._M_elems[0] = 0;
  local_f8._M_elems[1] = 0;
  pdVar2 = dnet::data_types::tensor<double,_2U>::operator[]
                     ((tensor<double,_2U> *)&gtest_ar.message_,&local_f8);
  local_fc = 0x46;
  testing::internal::EqHelper<false>::Compare<double,int>
            ((EqHelper<false> *)local_f0,"(grad_x[{0, 0}])","70",pdVar2,&local_fc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/nn/operators/op_test.cc"
               ,0x4b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  local_128._M_elems[0] = 1;
  local_128._M_elems[1] = 0;
  pdVar2 = dnet::data_types::tensor<double,_2U>::operator[]
                     ((tensor<double,_2U> *)&gtest_ar.message_,&local_128);
  local_12c = 0x50;
  testing::internal::EqHelper<false>::Compare<double,int>
            ((EqHelper<false> *)local_120,"(grad_x[{1, 0}])","80",pdVar2,&local_12c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/nn/operators/op_test.cc"
               ,0x4c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  local_158._M_elems[0] = 2;
  local_158._M_elems[1] = 0;
  pdVar2 = dnet::data_types::tensor<double,_2U>::operator[]
                     ((tensor<double,_2U> *)&gtest_ar.message_,&local_158);
  local_15c = 0x5a;
  testing::internal::EqHelper<false>::Compare<double,int>
            ((EqHelper<false> *)local_150,"(grad_x[{2, 0}])","90",pdVar2,&local_15c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/nn/operators/op_test.cc"
               ,0x4d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  local_188._M_elems[0] = 0;
  local_188._M_elems[1] = 0;
  pdVar2 = dnet::data_types::tensor<double,_2U>::operator[]
                     ((tensor<double,_2U> *)local_a0,&local_188);
  local_18c = 1;
  testing::internal::EqHelper<false>::Compare<double,int>
            ((EqHelper<false> *)local_180,"(grad_W[{0, 0}])","1",pdVar2,&local_18c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/nn/operators/op_test.cc"
               ,0x4e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  local_1b8._M_elems[0] = 0;
  local_1b8._M_elems[1] = 2;
  pdVar2 = dnet::data_types::tensor<double,_2U>::operator[]
                     ((tensor<double,_2U> *)local_a0,&local_1b8);
  local_1bc = 3;
  testing::internal::EqHelper<false>::Compare<double,int>
            ((EqHelper<false> *)local_1b0,"(grad_W[{0, 2}])","3",pdVar2,&local_1bc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/nn/operators/op_test.cc"
               ,0x4f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  local_1e8._M_elems[0] = 1;
  local_1e8._M_elems[1] = 1;
  pdVar2 = dnet::data_types::tensor<double,_2U>::operator[]
                     ((tensor<double,_2U> *)local_a0,&local_1e8);
  local_1ec = 4;
  testing::internal::EqHelper<false>::Compare<double,int>
            ((EqHelper<false> *)local_1e0,"(grad_W[{1, 1}])","4",pdVar2,&local_1ec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/nn/operators/op_test.cc"
               ,0x50,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  local_218._M_elems[0] = 2;
  local_218._M_elems[1] = 3;
  pdVar2 = dnet::data_types::tensor<double,_2U>::operator[]
                     ((tensor<double,_2U> *)local_a0,&local_218);
  local_21c = 0xc;
  testing::internal::EqHelper<false>::Compare<double,int>
            ((EqHelper<false> *)local_210,"(grad_W[{2, 3}])","12",pdVar2,&local_21c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/nn/operators/op_test.cc"
               ,0x51,pcVar3);
    testing::internal::AssertHelper::operator=(&local_230,&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  dnet::data_types::matrix::~matrix((matrix *)&gtest_ar.message_);
  dnet::data_types::matrix::~matrix((matrix *)local_a0);
  dnet::nn::dotgrad_ret_type::~dotgrad_ret_type
            ((dotgrad_ret_type *)&grad_W.super_tensor<double,_2U>._shape);
  return;
}

Assistant:

TEST_F(dot_grad_test, calculation)
    {
        auto res = cal_dot_grad(*_W, *_x, *_grad_y);
        auto grad_W = res.grad_w;
        auto grad_x = res.grad_x;
        EXPECT_EQ((grad_x[{0, 0}]), 70);
        EXPECT_EQ((grad_x[{1, 0}]), 80);
        EXPECT_EQ((grad_x[{2, 0}]), 90);
        EXPECT_EQ((grad_W[{0, 0}]), 1);
        EXPECT_EQ((grad_W[{0, 2}]), 3);
        EXPECT_EQ((grad_W[{1, 1}]), 4);
        EXPECT_EQ((grad_W[{2, 3}]), 12);
    }